

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingEnums.cpp
# Opt level: O0

cx_string<19UL> * mserialize::CustomTag<Nest::Nested,_void>::tag_string(void)

{
  cx_string<19UL> *in_RDI;
  cx_string<6UL> *in_stack_00000080;
  cx_string<1UL> *in_stack_00000088;
  cx_string<9UL> *in_stack_00000090;
  cx_string<1UL> *in_stack_00000098;
  cx_string<1UL> *in_stack_000000a0;
  cx_string<1UL> *in_stack_000000b0;
  char (*in_stack_ffffffffffffffb8) [7];
  cx_string<19UL> *str;
  
  str = in_RDI;
  make_cx_string<2UL>((char (*) [2])in_stack_ffffffffffffffb8);
  tag<unsigned_int>();
  make_cx_string<10UL>(str->_data);
  detail::integer_to_hex<unsigned_int,_0U>();
  make_cx_string<7UL>(in_stack_ffffffffffffffb8);
  make_cx_string<2UL>((char (*) [2])in_stack_ffffffffffffffb8);
  cx_strcat<1ul,1ul,9ul,1ul,6ul,1ul>
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080,in_stack_000000b0);
  return in_RDI;
}

Assistant:

int main()
{
  //[basic
  BINLOG_INFO("Enum: {}", Alpha);
  // Outputs: Enum: 123
  //]

  //[adapted

  BINLOG_INFO("Adapted enum: {}", Delta);
  // Outputs: Adapted enum: Delta
  //]

  //[scoped

  BINLOG_INFO("Scoped enum: {}", ScopedEnum::Epsilon);
  // Outputs: Scoped enum: Epsilon

  //]

  BINLOG_INFO("Partially adapted enum: {} {} {}", Rho, Sigma, Tau);
  // Outputs: Partially adapted enum: Rho Sigma 0x28

  BINLOG_INFO("Shadowed enum type: {}", Nest::Nested::Bird);
  // Outputs: Shadowed enum type: Bird

  binlog::consume(std::cout);
  return 0;
}